

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O3

ReadFileResult
cmCMakePresetsGraphInternal::WorkflowPresetsHelper
          (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::WorkflowPreset> *in_R8;
  Value *local_40;
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member>_>
  local_38;
  undefined5 uStack_20;
  undefined3 local_1b;
  undefined5 uStack_18;
  
  if (WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member>_>
      ::vector(&local_38,
               (vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member>_>
                *)(anonymous_namespace)::WorkflowPresetHelper);
      uStack_18 = (anonymous_namespace)::WorkflowPresetHelper._32_5_;
      uStack_20 = (anonymous_namespace)::WorkflowPresetHelper._24_5_;
      local_1b = (anonymous_namespace)::WorkflowPresetHelper._29_3_;
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::WorkflowPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>>
                (&WorkflowPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member>_>
      ::~vector(&local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,&WorkflowPresetsHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  local_40 = value;
  if (WorkflowPresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*WorkflowPresetsHelper::helper._M_invoker)
                      ((_Any_data *)&WorkflowPresetsHelper::helper,out,&local_40);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult WorkflowPresetsHelper(
  std::vector<cmCMakePresetsGraph::WorkflowPreset>& out,
  const Json::Value* value)
{
  static auto const helper =
    cmJSONHelperBuilder<ReadFileResult>::Vector<WorkflowPreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
      WorkflowPresetHelper);

  return helper(out, value);
}